

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O1

QPixmapStylePrivate * __thiscall
QPixmapStylePrivate::scale
          (QPixmapStylePrivate *this,int w,int h,QPixmap *pixmap,QPixmapStyleDescriptor *desc)

{
  long lVar1;
  long in_FS_OFFSET;
  QRect local_88;
  QRect local_78;
  QMargins local_68;
  QPainter p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&(this->super_QCommonStylePrivate).super_QStylePrivate.field_0x10 =
       &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QCommonStylePrivate).super_QStylePrivate = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QCommonStylePrivate).super_QStylePrivate.field_0x8 =
       &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)this,w,h);
  QPixmap::fill((QColor *)this);
  _p = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&p,(QPaintDevice *)this);
  local_68.m_left.m_i = (desc->margins).m_left.m_i;
  local_68.m_top.m_i = (desc->margins).m_top.m_i;
  local_68.m_right.m_i = (desc->margins).m_right.m_i;
  local_68.m_bottom.m_i = (desc->margins).m_bottom.m_i;
  local_78 = (QRect)QPixmap::rect();
  local_88 = (QRect)QPixmap::rect();
  qDrawBorderPixmap(&p,&local_78,&local_68,pixmap,&local_88,&local_68,&desc->tileRules,
                    (DrawingHints)0x0);
  QPainter::~QPainter(&p);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QPixmapStylePrivate::scale(int w, int h, const QPixmap &pixmap, const QPixmapStyleDescriptor &desc)
{
    QPixmap result(w, h);
    {
        const QColor transparent(0, 0, 0, 0);
        result.fill( transparent );
        QPainter p( &result );
        const QMargins margins = desc.margins;
        qDrawBorderPixmap(&p, result.rect(), margins, pixmap,
                          pixmap.rect(), margins, desc.tileRules);
    }
    return result;
}